

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PortConnection * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,bool>
          (BumpAllocator *this,MultiPortSymbol *args,bool *args_1)

{
  bool bVar1;
  PortConnection *pPVar2;
  
  pPVar2 = (PortConnection *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PortConnection *)this->endPtr < pPVar2 + 1) {
    pPVar2 = (PortConnection *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pPVar2 + 1);
  }
  bVar1 = *args_1;
  pPVar2->port = &args->super_Symbol;
  pPVar2->connectedSymbol = (Symbol *)0x0;
  pPVar2->expr = (Expression *)0x0;
  pPVar2->modport = (ModportSymbol *)0x0;
  (pPVar2->field_4).exprSyntax = (ExpressionSyntax *)0x0;
  pPVar2->useDefault = bVar1;
  pPVar2->isImplicit = false;
  return pPVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }